

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsDeleteIndexedProperty(JsValueRef object,JsValueRef index)

{
  anon_class_16_2_6fb4ecfe fn;
  JsErrorCode JVar1;
  JsValueRef local_18;
  JsValueRef index_local;
  JsValueRef object_local;
  
  fn.index = &local_18;
  fn.object = &index_local;
  local_18 = index;
  index_local = object;
  JVar1 = ContextAPIWrapper<false,JsDeleteIndexedProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsDeleteIndexedProperty(_In_ JsValueRef object, _In_ JsValueRef index)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(index, scriptContext);

        Js::JavascriptOperators::OP_DeleteElementI((Js::Var)object, (Js::Var)index, scriptContext);

        return JsNoError;
    });
}